

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtablez_sampler.h
# Opt level: O0

void absl::lts_20250127::container_internal::Sample
               (size_t inline_element_size,size_t key_size,size_t value_size,uint16_t soo_capacity)

{
  uint16_t soo_capacity_local;
  size_t value_size_local;
  size_t key_size_local;
  size_t inline_element_size_local;
  
  HashtablezInfoHandle::HashtablezInfoHandle
            ((HashtablezInfoHandle *)((long)&inline_element_size_local + 7),(nullptr_t)0x0);
  return;
}

Assistant:

inline HashtablezInfoHandle Sample(
    ABSL_ATTRIBUTE_UNUSED size_t inline_element_size,
    ABSL_ATTRIBUTE_UNUSED size_t key_size,
    ABSL_ATTRIBUTE_UNUSED size_t value_size,
    ABSL_ATTRIBUTE_UNUSED uint16_t soo_capacity) {
#if defined(ABSL_INTERNAL_HASHTABLEZ_SAMPLE)
  if (ABSL_PREDICT_TRUE(--global_next_sample.next_sample > 0)) {
    return HashtablezInfoHandle(nullptr);
  }
  return HashtablezInfoHandle(SampleSlow(global_next_sample,
                                         inline_element_size, key_size,
                                         value_size, soo_capacity));
#else
  return HashtablezInfoHandle(nullptr);
#endif  // !ABSL_PER_THREAD_TLS
}